

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_slb_create_load_balancer_ht_tp_slistener.cc
# Opt level: O1

int __thiscall
aliyun::Slb::CreateLoadBalancerHTTPSListener
          (Slb *this,SlbCreateLoadBalancerHTTPSListenerRequestType *req,
          SlbCreateLoadBalancerHTTPSListenerResponseType *response,SlbErrorInfo *error_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator *piVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  AliRpcRequest *this_00;
  long *plVar7;
  size_t sVar8;
  Value *pVVar9;
  size_type *psVar10;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  allocator<char> local_919;
  string local_918;
  Value local_8f8;
  long *local_8e0;
  long local_8d8;
  long local_8d0 [2];
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
  local_8c0._M_string_length = 0;
  local_8c0.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar6 = "https";
  }
  local_8e0 = local_8d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8e0,pcVar6,pcVar6 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_918);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_8f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,this->secret_,&local_919);
  piVar2 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar2->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_8e0,local_8d8 + (long)local_8e0);
  std::__cxx11::string::append((char *)&local_140);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_8a0.field_2._M_allocated_capacity = *psVar10;
    local_8a0.field_2._8_8_ = plVar7[3];
    local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  }
  else {
    local_8a0.field_2._M_allocated_capacity = *psVar10;
    local_8a0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_8a0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_8a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar2) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar8 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar6,pcVar6 + sVar8);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_8f8,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"CreateLoadBalancerHTTPSListener","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OwnerId","");
    pcVar3 = (req->owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar3,pcVar3 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResourceOwnerAccount","");
    pcVar3 = (req->resource_owner_account)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar3,pcVar3 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ResourceOwnerId","");
    pcVar3 = (req->resource_owner_id)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar3,pcVar3 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->load_balancer_id)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"LoadBalancerId","");
    pcVar3 = (req->load_balancer_id)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar3,pcVar3 + (req->load_balancer_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->bandwidth)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"Bandwidth","");
    pcVar3 = (req->bandwidth)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar3,pcVar3 + (req->bandwidth)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->listener_port)._M_string_length != 0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"ListenerPort","");
    pcVar3 = (req->listener_port)._M_dataplus._M_p;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,pcVar3,pcVar3 + (req->listener_port)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->backend_server_port)._M_string_length != 0) {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"BackendServerPort","");
    pcVar3 = (req->backend_server_port)._M_dataplus._M_p;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,pcVar3,pcVar3 + (req->backend_server_port)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->xforwarded_for)._M_string_length != 0) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"XForwardedFor","");
    pcVar3 = (req->xforwarded_for)._M_dataplus._M_p;
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_420,pcVar3,pcVar3 + (req->xforwarded_for)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scheduler)._M_string_length != 0) {
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"Scheduler","");
    pcVar3 = (req->scheduler)._M_dataplus._M_p;
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_460,pcVar3,pcVar3 + (req->scheduler)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->sticky_session)._M_string_length != 0) {
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"StickySession","");
    pcVar3 = (req->sticky_session)._M_dataplus._M_p;
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a0,pcVar3,pcVar3 + (req->sticky_session)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_480,&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->sticky_session_type)._M_string_length != 0) {
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"StickySessionType","");
    pcVar3 = (req->sticky_session_type)._M_dataplus._M_p;
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e0,pcVar3,pcVar3 + (req->sticky_session_type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4c0,&local_4e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->cookie_timeout)._M_string_length != 0) {
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"CookieTimeout","");
    pcVar3 = (req->cookie_timeout)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar3,pcVar3 + (req->cookie_timeout)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_500,&local_520);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->cookie)._M_string_length != 0) {
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"Cookie","");
    pcVar3 = (req->cookie)._M_dataplus._M_p;
    local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_560,pcVar3,pcVar3 + (req->cookie)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_540,&local_560);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._M_dataplus._M_p != &local_560.field_2) {
      operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->health_check)._M_string_length != 0) {
    local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"HealthCheck","");
    pcVar3 = (req->health_check)._M_dataplus._M_p;
    local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a0,pcVar3,pcVar3 + (req->health_check)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_580,&local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
      operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->health_check_domain)._M_string_length != 0) {
    local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"HealthCheckDomain","");
    pcVar3 = (req->health_check_domain)._M_dataplus._M_p;
    local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5e0,pcVar3,pcVar3 + (req->health_check_domain)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5c0,&local_5e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
      operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
      operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->health_check_ur_i)._M_string_length != 0) {
    local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"HealthCheckURI","");
    pcVar3 = (req->health_check_ur_i)._M_dataplus._M_p;
    local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_620,pcVar3,pcVar3 + (req->health_check_ur_i)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_600,&local_620);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_620._M_dataplus._M_p != &local_620.field_2) {
      operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p != &local_600.field_2) {
      operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->healthy_threshold)._M_string_length != 0) {
    local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"HealthyThreshold","");
    pcVar3 = (req->healthy_threshold)._M_dataplus._M_p;
    local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_660,pcVar3,pcVar3 + (req->healthy_threshold)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_640,&local_660);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660._M_dataplus._M_p != &local_660.field_2) {
      operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640._M_dataplus._M_p != &local_640.field_2) {
      operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->unhealthy_threshold)._M_string_length != 0) {
    local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"UnhealthyThreshold","");
    pcVar3 = (req->unhealthy_threshold)._M_dataplus._M_p;
    local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6a0,pcVar3,pcVar3 + (req->unhealthy_threshold)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_680,&local_6a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_680._M_dataplus._M_p != &local_680.field_2) {
      operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->health_check_timeout)._M_string_length != 0) {
    local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"HealthCheckTimeout","");
    pcVar3 = (req->health_check_timeout)._M_dataplus._M_p;
    local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6e0,pcVar3,pcVar3 + (req->health_check_timeout)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6c0,&local_6e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
      operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
      operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->health_check_connect_port)._M_string_length != 0) {
    local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_700,"HealthCheckConnectPort","");
    pcVar3 = (req->health_check_connect_port)._M_dataplus._M_p;
    local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_720,pcVar3,
               pcVar3 + (req->health_check_connect_port)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_700,&local_720);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_720._M_dataplus._M_p != &local_720.field_2) {
      operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_700._M_dataplus._M_p != &local_700.field_2) {
      operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->health_check_interval)._M_string_length != 0) {
    local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"HealthCheckInterval","");
    pcVar3 = (req->health_check_interval)._M_dataplus._M_p;
    local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_760,pcVar3,pcVar3 + (req->health_check_interval)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_740,&local_760);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_760._M_dataplus._M_p != &local_760.field_2) {
      operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_740._M_dataplus._M_p != &local_740.field_2) {
      operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->health_check_http_code)._M_string_length != 0) {
    local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"HealthCheckHttpCode","");
    pcVar3 = (req->health_check_http_code)._M_dataplus._M_p;
    local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7a0,pcVar3,pcVar3 + (req->health_check_http_code)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_780,&local_7a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
      operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_780._M_dataplus._M_p != &local_780.field_2) {
      operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->server_certificate_id)._M_string_length != 0) {
    local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"ServerCertificateId","");
    pcVar3 = (req->server_certificate_id)._M_dataplus._M_p;
    local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7e0,pcVar3,pcVar3 + (req->server_certificate_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_7c0,&local_7e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
      operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
      operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->max_conn_limit)._M_string_length != 0) {
    local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"MaxConnLimit","");
    pcVar3 = (req->max_conn_limit)._M_dataplus._M_p;
    local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_820,pcVar3,pcVar3 + (req->max_conn_limit)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_800,&local_820);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_820._M_dataplus._M_p != &local_820.field_2) {
      operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_800._M_dataplus._M_p != &local_800.field_2) {
      operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"OwnerAccount","");
    pcVar3 = (req->owner_account)._M_dataplus._M_p;
    local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_860,pcVar3,pcVar3 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_840,&local_860);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840._M_dataplus._M_p != &local_840.field_2) {
      operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_880,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)&local_918);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_880,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != &local_880.field_2) {
      operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar5 == 0) {
    iVar5 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_8c0);
    if ((0 < iVar5) && (local_8c0._M_string_length != 0)) {
      bVar4 = Json::Reader::parse(&local_140,&local_8c0,&local_8f8,true);
      if (bVar4) {
        if (error_info != (SlbErrorInfo *)0x0 && iVar5 != 200) {
          bVar4 = Json::Value::isMember(&local_8f8,"RequestId");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_8f8,"RequestId");
            Json::Value::asString_abi_cxx11_(&local_918,pVVar9);
          }
          else {
            local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_918,anon_var_dwarf_27d9af + 9);
          }
          std::__cxx11::string::operator=((string *)error_info,(string *)&local_918);
          paVar1 = &local_918.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_918._M_dataplus._M_p != paVar1) {
            operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Json::Value::isMember(&local_8f8,"Code");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_8f8,"Code");
            Json::Value::asString_abi_cxx11_(&local_918,pVVar9);
          }
          else {
            local_918._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_918,anon_var_dwarf_27d9af + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_918);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_918._M_dataplus._M_p != paVar1) {
            operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Json::Value::isMember(&local_8f8,"HostId");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_8f8,"HostId");
            Json::Value::asString_abi_cxx11_(&local_918,pVVar9);
          }
          else {
            local_918._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_918,anon_var_dwarf_27d9af + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_918);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_918._M_dataplus._M_p != paVar1) {
            operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Json::Value::isMember(&local_8f8,"Message");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_8f8,"Message");
            Json::Value::asString_abi_cxx11_(&local_918,pVVar9);
          }
          else {
            local_918._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_918,anon_var_dwarf_27d9af + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_918);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_918._M_dataplus._M_p != paVar1) {
            operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_00131780;
      }
    }
    if (error_info == (SlbErrorInfo *)0x0) goto LAB_0013177b;
    pcVar6 = "parse response failed";
  }
  else {
    if (error_info == (SlbErrorInfo *)0x0) {
LAB_0013177b:
      iVar5 = -1;
      goto LAB_00131780;
    }
    pcVar6 = "connect to host failed";
  }
  iVar5 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar6);
LAB_00131780:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_8f8);
  if (local_8e0 != local_8d0) {
    operator_delete(local_8e0,local_8d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
    operator_delete(local_8c0._M_dataplus._M_p,
                    CONCAT71(local_8c0.field_2._M_allocated_capacity._1_7_,
                             local_8c0.field_2._M_local_buf[0]) + 1);
  }
  return iVar5;
}

Assistant:

int Slb::CreateLoadBalancerHTTPSListener(const SlbCreateLoadBalancerHTTPSListenerRequestType& req,
                      SlbCreateLoadBalancerHTTPSListenerResponseType* response,
                       SlbErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","CreateLoadBalancerHTTPSListener");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.load_balancer_id.empty()) {
    req_rpc->AddRequestQuery("LoadBalancerId", req.load_balancer_id);
  }
  if(!req.bandwidth.empty()) {
    req_rpc->AddRequestQuery("Bandwidth", req.bandwidth);
  }
  if(!req.listener_port.empty()) {
    req_rpc->AddRequestQuery("ListenerPort", req.listener_port);
  }
  if(!req.backend_server_port.empty()) {
    req_rpc->AddRequestQuery("BackendServerPort", req.backend_server_port);
  }
  if(!req.xforwarded_for.empty()) {
    req_rpc->AddRequestQuery("XForwardedFor", req.xforwarded_for);
  }
  if(!req.scheduler.empty()) {
    req_rpc->AddRequestQuery("Scheduler", req.scheduler);
  }
  if(!req.sticky_session.empty()) {
    req_rpc->AddRequestQuery("StickySession", req.sticky_session);
  }
  if(!req.sticky_session_type.empty()) {
    req_rpc->AddRequestQuery("StickySessionType", req.sticky_session_type);
  }
  if(!req.cookie_timeout.empty()) {
    req_rpc->AddRequestQuery("CookieTimeout", req.cookie_timeout);
  }
  if(!req.cookie.empty()) {
    req_rpc->AddRequestQuery("Cookie", req.cookie);
  }
  if(!req.health_check.empty()) {
    req_rpc->AddRequestQuery("HealthCheck", req.health_check);
  }
  if(!req.health_check_domain.empty()) {
    req_rpc->AddRequestQuery("HealthCheckDomain", req.health_check_domain);
  }
  if(!req.health_check_ur_i.empty()) {
    req_rpc->AddRequestQuery("HealthCheckURI", req.health_check_ur_i);
  }
  if(!req.healthy_threshold.empty()) {
    req_rpc->AddRequestQuery("HealthyThreshold", req.healthy_threshold);
  }
  if(!req.unhealthy_threshold.empty()) {
    req_rpc->AddRequestQuery("UnhealthyThreshold", req.unhealthy_threshold);
  }
  if(!req.health_check_timeout.empty()) {
    req_rpc->AddRequestQuery("HealthCheckTimeout", req.health_check_timeout);
  }
  if(!req.health_check_connect_port.empty()) {
    req_rpc->AddRequestQuery("HealthCheckConnectPort", req.health_check_connect_port);
  }
  if(!req.health_check_interval.empty()) {
    req_rpc->AddRequestQuery("HealthCheckInterval", req.health_check_interval);
  }
  if(!req.health_check_http_code.empty()) {
    req_rpc->AddRequestQuery("HealthCheckHttpCode", req.health_check_http_code);
  }
  if(!req.server_certificate_id.empty()) {
    req_rpc->AddRequestQuery("ServerCertificateId", req.server_certificate_id);
  }
  if(!req.max_conn_limit.empty()) {
    req_rpc->AddRequestQuery("MaxConnLimit", req.max_conn_limit);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}